

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

bool __thiscall
Darts::Details::DoubleArrayBuilder::is_valid_offset
          (DoubleArrayBuilder *this,id_type id,id_type offset)

{
  byte *pbVar1;
  DoubleArrayBuilderExtraUnit *pDVar2;
  ulong uVar3;
  bool bVar4;
  
  pDVar2 = (this->extras_).array_;
  if ((pDVar2[offset & 0xfff].is_used_ == false) &&
     ((char)(offset ^ id) == '\0' || ((offset ^ id) & 0x1fe00000) == 0)) {
    uVar3 = 1;
    do {
      bVar4 = (this->labels_).size_ <= uVar3;
      if (bVar4) {
        return bVar4;
      }
      pbVar1 = (byte *)((this->labels_).buf_.array_ + uVar3);
      uVar3 = uVar3 + 1;
    } while (pDVar2[(uint)*pbVar1 ^ offset & 0xfff].is_fixed_ != true);
    return bVar4;
  }
  return false;
}

Assistant:

const extra_type &extras(id_type id) const {
    return extras_[id % NUM_EXTRAS];
  }